

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
               (TestResults *results,float (*expected) [3] [3],float (*actual) [3] [3],int rows,
               int columns,float *tolerance,TestDetails *details)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ostream *poVar4;
  char *failure;
  ulong uVar5;
  float (*pafVar6) [3];
  int actualRow;
  float (*pafVar7) [3];
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  MemoryOutStream stream;
  undefined1 local_1c8 [408];
  
  if (0 < rows) {
    uVar11 = (ulong)(uint)columns;
    uVar9 = (ulong)(uint)rows;
    bVar3 = true;
    uVar5 = 0;
    pafVar6 = *expected;
    pafVar7 = *actual;
    do {
      bVar8 = 1;
      if (0 < columns) {
        uVar10 = 0;
        do {
          fVar1 = (*(float (*) [3])*pafVar6)[uVar10];
          fVar2 = (*(float (*) [3])*pafVar7)[uVar10];
          bVar8 = bVar8 & (fVar2 <= *tolerance + fVar1 && fVar1 - *tolerance <= fVar2);
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      bVar3 = (bool)(bVar3 & bVar8);
      uVar5 = uVar5 + 1;
      pafVar7 = pafVar7 + 1;
      pafVar6 = pafVar6 + 1;
    } while (uVar5 != uVar9);
    if (!bVar3) {
      MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Expected [ ",0xb);
      uVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar10 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>
                               ((double)(*(float (*) [3])(*expected)[0])[uVar10]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar5 = uVar5 + 1;
        expected = (float (*) [3] [3])((long)expected + 0xc);
      } while (uVar5 != uVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] +/- ",6);
      poVar4 = std::ostream::_M_insert<double>((double)*tolerance);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," but was [ ",0xb);
      uVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar10 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>((double)(*(float (*) [3])(*actual)[0])[uVar10])
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar5 = uVar5 + 1;
        actual = (float (*) [3] [3])((long)actual + 0xc);
      } while (uVar5 != uVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"]",1);
      failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
      TestResults::OnTestFailure(results,details,failure);
      MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8,&MemoryOutStream::VTT);
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x90));
    }
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}